

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_sectionstyle.cpp
# Opt level: O1

ON_SectionStyle * __thiscall
ON_SectionStyle::operator=(ON_SectionStyle *this,ON_SectionStyle *other)

{
  ON_SectionStylePrivate *pOVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  double dVar3;
  double dVar4;
  double dVar5;
  SectionFillRule SVar6;
  undefined2 uVar7;
  int iVar8;
  ON_Color OVar9;
  ON_Color OVar10;
  ON_Color OVar11;
  ON_Color OVar12;
  ON_Color OVar13;
  ON_Color OVar14;
  bool bVar15;
  undefined7 uVar16;
  ON_SectionStylePrivate *pOVar17;
  
  if (this != other) {
    ON_ModelComponent::operator=(&this->super_ON_ModelComponent,&other->super_ON_ModelComponent);
    pOVar1 = this->m_private;
    if (pOVar1 != (ON_SectionStylePrivate *)0x0) {
      p_Var2 = (pOVar1->m_custom_linetype).
               super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
      }
      operator_delete(pOVar1,0x50);
      this->m_private = (ON_SectionStylePrivate *)0x0;
    }
    pOVar1 = other->m_private;
    if (pOVar1 != (ON_SectionStylePrivate *)0x0) {
      pOVar17 = (ON_SectionStylePrivate *)operator_new(0x50);
      SVar6 = pOVar1->m_fill_rule;
      uVar7 = *(undefined2 *)&pOVar1->field_0x2;
      iVar8 = pOVar1->m_hatch_index;
      dVar3 = pOVar1->m_hatch_scale;
      dVar4 = pOVar1->m_hatch_rotation;
      OVar9.field_0 = (pOVar1->m_background_fill_color).field_0;
      OVar10.field_0 = (pOVar1->m_background_fill_print_color).field_0;
      OVar11.field_0 = (pOVar1->m_boundary_color).field_0;
      OVar12.field_0 = (pOVar1->m_boundary_print_color).field_0;
      OVar13.field_0 = (pOVar1->m_hatch_color).field_0;
      OVar14.field_0 = (pOVar1->m_hatch_print_color).field_0;
      bVar15 = pOVar1->m_boundary_visible;
      uVar16 = *(undefined7 *)&pOVar1->field_0x31;
      dVar5 = pOVar1->m_boundary_width_scale;
      pOVar17->m_background_fill_mode = pOVar1->m_background_fill_mode;
      pOVar17->m_fill_rule = SVar6;
      *(undefined2 *)&pOVar17->field_0x2 = uVar7;
      pOVar17->m_hatch_index = iVar8;
      pOVar17->m_hatch_scale = dVar3;
      pOVar17->m_hatch_rotation = dVar4;
      pOVar17->m_background_fill_color = (ON_Color)OVar9.field_0;
      pOVar17->m_background_fill_print_color = (ON_Color)OVar10.field_0;
      pOVar17->m_boundary_color = (ON_Color)OVar11.field_0;
      pOVar17->m_boundary_print_color = (ON_Color)OVar12.field_0;
      pOVar17->m_hatch_color = (ON_Color)OVar13.field_0;
      pOVar17->m_hatch_print_color = (ON_Color)OVar14.field_0;
      pOVar17->m_boundary_visible = bVar15;
      *(undefined7 *)&pOVar17->field_0x31 = uVar16;
      pOVar17->m_boundary_width_scale = dVar5;
      (pOVar17->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (pOVar1->m_custom_linetype).
               super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      p_Var2 = (pOVar1->m_custom_linetype).
               super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pOVar17->m_custom_linetype).super___shared_ptr<ON_Linetype,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var2;
      if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        }
      }
      this->m_private = pOVar17;
    }
  }
  return this;
}

Assistant:

ON_SectionStyle& ON_SectionStyle::operator=(const ON_SectionStyle& other)
{
  if (this != &other)
  {
    ON_ModelComponent::operator=(other);
    if (m_private)
    {
      delete m_private;
      m_private = nullptr;
    }
    if (other.m_private)
      m_private = new ON_SectionStylePrivate(*other.m_private);
  }
  return *this;
}